

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  ushort uVar1;
  ushort uVar2;
  mz_zip_internal_state *pmVar3;
  uint uVar4;
  mz_bool mVar5;
  time_t tVar6;
  long lVar7;
  tm local_58;
  
  if ((((pZip == (mz_zip_archive *)0x0) ||
       (pmVar3 = pZip->m_pState, pmVar3 == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    lVar7 = 0;
  }
  else {
    lVar7 = (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
            (long)(pmVar3->m_central_dir).m_p;
  }
  mVar5 = 0;
  if ((pStat != (mz_zip_archive_file_stat *)0x0) && (mVar5 = 0, lVar7 != 0)) {
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs =
         *(mz_uint32 *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + (ulong)file_index * 4);
    pStat->m_version_made_by = *(mz_uint16 *)(lVar7 + 4);
    pStat->m_version_needed = *(mz_uint16 *)(lVar7 + 6);
    pStat->m_bit_flag = *(mz_uint16 *)(lVar7 + 8);
    pStat->m_method = *(mz_uint16 *)(lVar7 + 10);
    uVar1 = *(ushort *)(lVar7 + 0xc);
    uVar2 = *(ushort *)(lVar7 + 0xe);
    local_58.tm_gmtoff = 0;
    local_58.tm_wday = 0;
    local_58.tm_yday = 0;
    local_58.tm_zone = (char *)0x0;
    local_58.tm_isdst = -1;
    local_58._36_4_ = 0;
    local_58.tm_year = (uVar2 >> 9) + 0x50;
    local_58.tm_mon = (uVar2 >> 5 & 0xf) - 1;
    local_58._8_8_ = (ulong)CONCAT24(uVar2,(uint)(uVar1 >> 0xb)) & 0x1fffffffff;
    local_58._0_8_ = (ulong)CONCAT24(uVar1 >> 5,(uint)uVar1 * 2) & 0x3f0000003e;
    tVar6 = mktime(&local_58);
    pStat->m_time = tVar6;
    pStat->m_crc32 = *(mz_uint32 *)(lVar7 + 0x10);
    pStat->m_comp_size = (ulong)*(uint *)(lVar7 + 0x14);
    pStat->m_uncomp_size = (ulong)*(uint *)(lVar7 + 0x18);
    pStat->m_internal_attr = *(mz_uint16 *)(lVar7 + 0x24);
    pStat->m_external_attr = *(mz_uint32 *)(lVar7 + 0x26);
    pStat->m_local_header_ofs = (ulong)*(uint *)(lVar7 + 0x2a);
    uVar4 = 0x103;
    if (*(ushort *)(lVar7 + 0x1c) < 0x103) {
      uVar4 = (uint)*(ushort *)(lVar7 + 0x1c);
    }
    memcpy(pStat->m_filename,(void *)(lVar7 + 0x2e),(ulong)uVar4);
    pStat->m_filename[uVar4] = '\0';
    uVar4 = 0xff;
    if (*(ushort *)(lVar7 + 0x20) < 0xff) {
      uVar4 = (uint)*(ushort *)(lVar7 + 0x20);
    }
    pStat->m_comment_size = uVar4;
    memcpy(pStat->m_comment,
           (void *)((ulong)*(ushort *)(lVar7 + 0x1e) +
                   (ulong)*(ushort *)(lVar7 + 0x1c) + lVar7 + 0x2e),(ulong)uVar4);
    pStat->m_comment[uVar4] = '\0';
    mVar5 = 1;
  }
  return mVar5;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index, mz_zip_archive_file_stat *pStat)
{
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if ((!p) || (!pStat))
    return MZ_FALSE;

  // Unpack the central directory record.
  pStat->m_file_index = file_index;
  pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
  pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
  pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
  pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
  pStat->m_time = mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS), MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
  pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
  pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
  pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
  pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

  // Copy as much of the filename and comment as possible.
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS); n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
  memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n); pStat->m_filename[n] = '\0';

  n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS); n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
  pStat->m_comment_size = n;
  memcpy(pStat->m_comment, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS), n); pStat->m_comment[n] = '\0';

  return MZ_TRUE;
}